

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenStringEqSetRight(BinaryenExpressionRef expr,BinaryenExpressionRef rightExpr)

{
  if (expr->_id != StringEqId) {
    __assert_fail("expression->is<StringEq>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x125f,
                  "void BinaryenStringEqSetRight(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (rightExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = rightExpr;
    return;
  }
  __assert_fail("rightExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1260,
                "void BinaryenStringEqSetRight(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringEqSetRight(BinaryenExpressionRef expr,
                              BinaryenExpressionRef rightExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringEq>());
  assert(rightExpr);
  static_cast<StringEq*>(expression)->right = (Expression*)rightExpr;
}